

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int i_3;
  int k_3;
  double *scalingFactors;
  int i_2;
  double sumOverI;
  int k_2;
  int u;
  double *transMatrixPtr;
  int j;
  double sumOverJB;
  double sumOverJA;
  int i_1;
  double *partialsChildPtr;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int stateCountModFour;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  double *freqs;
  double *wt;
  double *transMatrix;
  double *partialsParent;
  int returnCode;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_7c;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_64;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_20;
  
  local_20 = 0;
  lVar3 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  lVar4 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_ECX * 8);
  lVar5 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)in_R8D * 8);
  lVar6 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_R9D * 8);
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8) != 0)) {
    lVar7 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8);
    local_4c = 0;
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x34); local_50 = local_50 + 1) {
      local_54 = 0;
      uVar1 = *(ulong *)(lVar5 + (long)local_50 * 8);
      for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x14); local_64 = local_64 + 1) {
        iVar2 = *(int *)(lVar7 + (long)local_64 * 4);
        local_6c = local_50 * *(int *)(in_RDI + 0x40);
        for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x24); local_70 = local_70 + 1) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar1;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_54 * 8);
          auVar20._8_8_ = 0;
          auVar20._0_8_ =
               *(double *)(lVar4 + (long)(local_6c + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_4c + local_70) * 8);
          auVar12 = vfmadd213sd_fma(auVar11,auVar20,auVar29);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_54 * 8) = auVar12._0_8_;
          local_54 = local_54 + 1;
          local_6c = *(int *)(in_RDI + 0x28) + local_6c;
        }
        local_4c = *(int *)(in_RDI + 0x2c) + local_4c;
      }
    }
  }
  else {
    lVar7 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_7c = 0;
    iVar2 = *(int *)(in_RDI + 0x24);
    for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x34); local_84 = local_84 + 1) {
      local_88 = 0;
      uVar1 = *(ulong *)(lVar5 + (long)local_84 * 8);
      for (local_94 = 0; local_94 < *(int *)(in_RDI + 0x14); local_94 = local_94 + 1) {
        local_98 = local_84 * *(int *)(in_RDI + 0x40);
        lVar8 = lVar7 + (long)local_7c * 8;
        for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x24); local_a4 = local_a4 + 1) {
          local_b0 = 0.0;
          local_b8 = 0.0;
          lVar9 = lVar4 + (long)local_98 * 8;
          for (local_bc = 0; local_bc < iVar2 / 4 << 2; local_bc = local_bc + 4) {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = *(ulong *)(lVar9 + (long)local_bc * 8);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(lVar8 + (long)local_bc * 8);
            auVar30._8_8_ = 0;
            auVar30._0_8_ = local_b0;
            auVar12 = vfmadd213sd_fma(auVar12,auVar21,auVar30);
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *(ulong *)(lVar9 + (long)(local_bc + 1) * 8);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)(lVar8 + (long)(local_bc + 1) * 8);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_b8;
            auVar13 = vfmadd213sd_fma(auVar13,auVar22,auVar31);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(ulong *)(lVar9 + (long)(local_bc + 2) * 8);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(lVar8 + (long)(local_bc + 2) * 8);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = auVar12._0_8_;
            auVar12 = vfmadd213sd_fma(auVar14,auVar23,auVar32);
            local_b0 = auVar12._0_8_;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = *(ulong *)(lVar9 + (long)(local_bc + 3) * 8);
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *(ulong *)(lVar8 + (long)(local_bc + 3) * 8);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = auVar13._0_8_;
            auVar12 = vfmadd213sd_fma(auVar15,auVar24,auVar33);
            local_b8 = auVar12._0_8_;
          }
          for (; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = *(ulong *)(lVar9 + (long)local_bc * 8);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *(ulong *)(lVar8 + (long)local_bc * 8);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = local_b0;
            auVar12 = vfmadd213sd_fma(auVar16,auVar25,auVar34);
            local_b0 = auVar12._0_8_;
          }
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar1;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_88 * 8);
          auVar26._8_8_ = 0;
          auVar26._0_8_ =
               (local_b0 + local_b8) * *(double *)(lVar3 + (long)(local_7c + local_a4) * 8);
          auVar12 = vfmadd213sd_fma(auVar17,auVar26,auVar35);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_88 * 8) = auVar12._0_8_;
          local_88 = local_88 + 1;
          local_98 = *(int *)(in_RDI + 0x24) + local_98 + 1;
        }
        local_7c = *(int *)(in_RDI + 0x2c) + local_7c;
      }
    }
  }
  local_cc = 0;
  for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x14); local_d0 = local_d0 + 1) {
    local_d8 = 0.0;
    for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x24); local_dc = local_dc + 1) {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar6 + (long)local_dc * 8);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_cc * 8);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_d8;
      auVar12 = vfmadd213sd_fma(auVar18,auVar27,auVar36);
      local_d8 = auVar12._0_8_;
      local_cc = local_cc + 1;
    }
    dVar10 = log(local_d8);
    *(double *)(*(long *)(in_RDI + 0x110) + (long)local_d0 * 8) = dVar10;
  }
  if (i_3 != -1) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)i_3 * 8);
    for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x14); local_ec = local_ec + 1) {
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) =
           *(double *)(lVar3 + (long)local_ec * 8) +
           *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8);
    }
  }
  *scalingFactors = 0.0;
  for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0x14); local_f0 = local_f0 + 1) {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_f0 * 8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_f0 * 8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *scalingFactors;
    auVar12 = vfmadd213sd_fma(auVar19,auVar28,auVar37);
    *scalingFactors = auVar12._0_8_;
  }
  if ((*scalingFactors != *scalingFactors) || (NAN(*scalingFactors) || NAN(*scalingFactors))) {
    local_20 = -8;
  }
  return local_20;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                     const int childIndex,
                                                     const int probIndex,
                                                     const int categoryWeightsIndex,
                                                     const int stateFrequenciesIndex,
                                                     const int scalingFactorsIndex,
                                                     double* outSumLogLikelihood) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));


    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;
        int stateCountModFour = (kStateCount / 4) * 4;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                const REALTYPE* partialsChildPtr = &partialsChild[v];
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJA = 0.0, sumOverJB = 0.0;
                    int j = 0;
                    const REALTYPE* transMatrixPtr = &transMatrix[w];
                    for (; j < stateCountModFour; j += 4) {
                        sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                        sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                        sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                        sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                    }
                    for (; j < kStateCount; j++) {
                        sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                    }
                    //                        for(int j = 0; j < kStateCount; j++) {
                    //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                    //                            w++;
                    //                        }
                    integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                    u++;

                    w += kStateCount;

                    // increment for the extra column at the end
                    w += T_PAD;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}